

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_mri.c
# Opt level: O0

int main(void)

{
  int iVar1;
  double dVar2;
  SUNContext ctx;
  long nff;
  long nfse;
  long nstf;
  long nsts;
  int iout;
  sunrealtype tout;
  sunrealtype t;
  FILE *UFID;
  MRIStepInnerStepper inner_stepper;
  void *inner_arkode_mem;
  void *arkode_mem;
  N_Vector y;
  int retval;
  sunrealtype rdata [3];
  sunrealtype w0;
  sunrealtype v0;
  sunrealtype u0;
  sunrealtype ep;
  sunrealtype b;
  sunrealtype a;
  sunrealtype hf;
  sunrealtype hs;
  int Nt;
  sunindextype NEQ;
  sunrealtype dTout;
  sunrealtype Tf;
  sunrealtype T0;
  int in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff00;
  void *in_stack_ffffffffffffff08;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  int local_cc;
  char *local_c8;
  double local_c0;
  FILE *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  long *local_98;
  undefined4 local_8c;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  int local_2c;
  undefined8 local_28;
  double local_20;
  char *local_18;
  double local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = 0.0;
  local_18 = (char *)0x4000000000000000;
  local_20 = 0.1;
  local_28 = 3;
  dVar2 = ceil(20.0);
  local_2c = (int)dVar2;
  local_38 = 0x3f9999999999999a;
  local_40 = 0x3f50624dd2f1a9fc;
  local_98 = (long *)0x0;
  local_a0 = 0;
  local_a8 = 0;
  local_b0 = 0;
  local_8c = SUNContext_Create(0,&stack0xffffffffffffff08);
  iVar1 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc
                      );
  if (iVar1 == 0) {
    local_48 = 0x3ff0000000000000;
    local_50 = 0x400c000000000000;
    local_58 = 0x3f847ae147ae147b;
    local_60 = 0x3ff3333333333333;
    local_68 = 0x4008cccccccccccd;
    local_70 = 0x4008000000000000;
    printf("\nBrusselator ODE test problem:\n");
    printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",local_60,local_68,local_70);
    printf("    problem parameters:  a = %g,  b = %g,  ep = %g\n",local_48,local_50,local_58);
    printf("    hs = %g,  hf = %g\n\n",local_38,local_40);
    local_88 = local_48;
    local_80 = local_50;
    local_78 = local_58;
    local_98 = (long *)N_VNew_Serial(local_28,in_stack_ffffffffffffff08);
    iVar1 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                         in_stack_fffffffffffffefc);
    if (iVar1 == 0) {
      **(undefined8 **)(*local_98 + 0x10) = local_60;
      *(undefined8 *)(*(long *)(*local_98 + 0x10) + 8) = local_68;
      *(undefined8 *)(*(long *)(*local_98 + 0x10) + 0x10) = local_70;
      local_a8 = ARKStepCreate(local_10,ff,0,local_98,in_stack_ffffffffffffff08);
      iVar1 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                           in_stack_fffffffffffffefc);
      if (iVar1 == 0) {
        local_8c = ARKodeSetUserData(local_a8,&local_88);
        iVar1 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffefc);
        if (iVar1 == 0) {
          local_8c = ARKStepSetTableNum(local_a8,0xffffffff,0xc);
          iVar1 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                               in_stack_fffffffffffffefc);
          if (iVar1 == 0) {
            local_8c = ARKodeSetFixedStep(local_40,local_a8);
            iVar1 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                 in_stack_fffffffffffffefc);
            if (iVar1 == 0) {
              local_8c = ARKodeCreateMRIStepInnerStepper(local_a8,&local_b0);
              iVar1 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                   in_stack_fffffffffffffefc);
              if (iVar1 == 0) {
                local_a0 = MRIStepCreate(local_10,fs,0,local_98,local_b0,in_stack_ffffffffffffff08);
                iVar1 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                     in_stack_fffffffffffffefc);
                if (iVar1 == 0) {
                  local_8c = ARKodeSetUserData(local_a0,&local_88);
                  iVar1 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                       in_stack_fffffffffffffefc);
                  if (iVar1 == 0) {
                    local_8c = ARKodeSetFixedStep(local_38,local_a0);
                    iVar1 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                         in_stack_fffffffffffffefc);
                    if (iVar1 == 0) {
                      local_b8 = fopen("ark_brusselator_mri_solution.txt","w");
                      fprintf(local_b8,"# t u v w\n");
                      fprintf(local_b8," %.16e %.16e %.16e %.16e\n",local_10,
                              **(undefined8 **)(*local_98 + 0x10),
                              *(undefined8 *)(*(long *)(*local_98 + 0x10) + 8),
                              *(undefined8 *)(*(long *)(*local_98 + 0x10) + 0x10));
                      local_c0 = local_10;
                      local_c8 = (char *)(local_10 + local_20);
                      printf("        t           u           v           w\n");
                      printf("   ----------------------------------------------\n");
                      printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",local_c0,
                             **(undefined8 **)(*local_98 + 0x10),
                             *(undefined8 *)(*(long *)(*local_98 + 0x10) + 8),
                             *(undefined8 *)(*(long *)(*local_98 + 0x10) + 0x10));
                      for (local_cc = 0; local_cc < local_2c; local_cc = local_cc + 1) {
                        local_8c = ARKodeEvolve(local_c8,local_a0,local_98,&local_c0,1);
                        iVar1 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                             in_stack_fffffffffffffefc);
                        if (iVar1 != 0) break;
                        printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",local_c0,
                               **(undefined8 **)(*local_98 + 0x10),
                               *(undefined8 *)(*(long *)(*local_98 + 0x10) + 8),
                               *(undefined8 *)(*(long *)(*local_98 + 0x10) + 0x10));
                        fprintf(local_b8," %.16e %.16e %.16e %.16e\n",local_c0,
                                **(undefined8 **)(*local_98 + 0x10),
                                *(undefined8 *)(*(long *)(*local_98 + 0x10) + 8),
                                *(undefined8 *)(*(long *)(*local_98 + 0x10) + 0x10));
                        in_stack_ffffffffffffff00 = (char *)(local_20 + (double)local_c8);
                        if ((double)local_18 < (double)in_stack_ffffffffffffff00) {
                          in_stack_ffffffffffffff00 = local_18;
                        }
                        local_c8 = in_stack_ffffffffffffff00;
                      }
                      printf("   ----------------------------------------------\n");
                      fclose(local_b8);
                      local_8c = ARKodeGetNumSteps(local_a0,&local_d8);
                      check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                   in_stack_fffffffffffffefc);
                      local_8c = ARKodeGetNumRhsEvals(local_a0,0,&local_e8);
                      check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                   in_stack_fffffffffffffefc);
                      local_8c = ARKodeGetNumSteps(local_a8,&local_e0);
                      check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                   in_stack_fffffffffffffefc);
                      local_8c = ARKodeGetNumRhsEvals(local_a8,0,&local_f0);
                      check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                   in_stack_fffffffffffffefc);
                      printf("\nFinal Solver Statistics:\n");
                      printf("   Steps: nsts = %li, nstf = %li\n",local_d8,local_e0);
                      printf("   Total RHS evals:  Fs = %li,  Ff = %li\n",local_e8,local_f0);
                      N_VDestroy(local_98);
                      ARKodeFree(&local_a8);
                      MRIStepInnerStepper_Free(&local_b0);
                      ARKodeFree(&local_a0);
                      SUNContext_Free(&stack0xffffffffffffff08);
                      local_4 = 0;
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf    = SUN_RCONST(2.0);       /* final time */
  sunrealtype dTout = SUN_RCONST(0.1);       /* time between outputs */
  sunindextype NEQ  = 3;                     /* number of dependent vars. */
  int Nt            = (int)ceil(Tf / dTout); /* number of output times */
  sunrealtype hs    = SUN_RCONST(0.025);     /* slow step size */
  sunrealtype hf    = SUN_RCONST(0.001);     /* fast step size */
  sunrealtype a, b, ep;                      /* ODE parameters */
  sunrealtype u0, v0, w0;                    /* initial conditions */
  sunrealtype rdata[3];                      /* user data */

  /* general problem variables */
  int retval;                    /* reusable error-checking flag */
  N_Vector y             = NULL; /* empty vector for storing solution */
  void* arkode_mem       = NULL; /* empty ARKode memory structure */
  void* inner_arkode_mem = NULL; /* empty ARKode memory structure */
  MRIStepInnerStepper inner_stepper = NULL; /* inner stepper */
  FILE* UFID;
  sunrealtype t, tout;
  int iout;
  long int nsts, nstf, nfse, nff;

  /*
   * Initialization
   */

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Set up the test problem parameters */
  a  = SUN_RCONST(1.0);
  b  = SUN_RCONST(3.5);
  ep = SUN_RCONST(1.0e-2);

  /* Set the initial contions */
  u0 = SUN_RCONST(1.2);
  v0 = SUN_RCONST(3.1);
  w0 = SUN_RCONST(3.0);

  /* Initial problem output */
  printf("\nBrusselator ODE test problem:\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);
  printf("    problem parameters:  a = %" GSYM ",  b = %" GSYM ",  ep = %" GSYM
         "\n",
         a, b, ep);
  printf("    hs = %" GSYM ",  hf = %" GSYM "\n\n", hs, hf);

  /* Set parameters in user data */
  rdata[0] = a;
  rdata[1] = b;
  rdata[2] = ep;

  /* Create and initialize serial vector for the solution */
  y = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = u0;
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  /*
   * Create the fast integrator and set options
   */

  /* Initialize the fast integrator. Specify the explicit fast right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the initial time T0, and the
     initial dependent variable vector y. */
  inner_arkode_mem = ARKStepCreate(ff, NULL, T0, y, ctx);
  if (check_retval((void*)inner_arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Attach user data to fast integrator */
  retval = ARKodeSetUserData(inner_arkode_mem, (void*)rdata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the fast method */
  retval = ARKStepSetTableNum(inner_arkode_mem, -1, ARKODE_KNOTH_WOLKE_3_3);
  if (check_retval(&retval, "ARKStepSetTableNum", 1)) { return 1; }

  /* Set the fast step size */
  retval = ARKodeSetFixedStep(inner_arkode_mem, hf);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create inner stepper */
  retval = ARKodeCreateMRIStepInnerStepper(inner_arkode_mem, &inner_stepper);
  if (check_retval(&retval, "ARKodeCreateMRIStepInnerStepper", 1)) { return 1; }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the slow integrator. Specify the explicit slow right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the initial time T0, the
     initial dependent variable vector y, and the fast integrator. */
  arkode_mem = MRIStepCreate(fs, NULL, T0, y, inner_stepper, ctx);
  if (check_retval((void*)arkode_mem, "MRIStepCreate", 0)) { return 1; }

  /* Pass rdata to user functions */
  retval = ARKodeSetUserData(arkode_mem, (void*)rdata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the slow step size */
  retval = ARKodeSetFixedStep(arkode_mem, hs);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /*
   * Integrate ODE
   */

  /* Open output stream for results, output comment line */
  UFID = fopen("ark_brusselator_mri_solution.txt", "w");
  fprintf(UFID, "# t u v w\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", T0,
          NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the
     integration, then prints results. Stops when the final time
     has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u           v           w\n");
  printf("   ----------------------------------------------\n");
  printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
         NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }

    /* access/print solution */
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", t,
            NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

    /* successful solve: update time */
    tout += dTout;
    tout = (tout > Tf) ? Tf : tout;
  }
  printf("   ----------------------------------------------\n");
  fclose(UFID);

  /*
   * Finalize
   */

  /* Get some slow integrator statistics */
  retval = ARKodeGetNumSteps(arkode_mem, &nsts);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumRhsEvals(arkode_mem, 0, &nfse);
  check_retval(&retval, "ARKodeGetNumRhsEvals", 1);

  /* Get some fast integrator statistics */
  retval = ARKodeGetNumSteps(inner_arkode_mem, &nstf);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumRhsEvals(inner_arkode_mem, 0, &nff);
  check_retval(&retval, "ARKodeGetNumRhsEvals", 1);

  /* Print some final statistics */
  printf("\nFinal Solver Statistics:\n");
  printf("   Steps: nsts = %li, nstf = %li\n", nsts, nstf);
  printf("   Total RHS evals:  Fs = %li,  Ff = %li\n", nfse, nff);

  /* Clean up and return */
  N_VDestroy(y);                            /* Free y vector */
  ARKodeFree(&inner_arkode_mem);            /* Free integrator memory */
  MRIStepInnerStepper_Free(&inner_stepper); /* Free inner stepper */
  ARKodeFree(&arkode_mem);                  /* Free integrator memory */
  SUNContext_Free(&ctx);                    /* Free context */

  return 0;
}